

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_list_expr(gvisitor_t *self,gnode_list_expr_t *node)

{
  gnode_r *pgVar1;
  _Bool _Var2;
  gnode_t *local_70;
  gnode_t *local_68;
  gnode_t *local_60;
  gnode_t *local_58;
  gnode_literal_expr_t *v;
  gnode_t *key;
  size_t k;
  gnode_t *e;
  size_t j;
  _Bool ismap;
  size_t n;
  gnode_list_expr_t *node_local;
  gvisitor_t *self_local;
  
  if (node->list1 == (gnode_r *)0x0) {
    local_58 = (gnode_t *)0x0;
  }
  else {
    local_58 = (gnode_t *)node->list1->n;
  }
  pgVar1 = node->list2;
  for (e = (gnode_t *)0x0; e < local_58; e = (gnode_t *)((long)&e->tag + 1)) {
    if (e < (gnode_t *)node->list1->n) {
      local_60 = node->list1->p[(long)e];
    }
    else {
      local_60 = (gnode_t *)0x0;
    }
    gvisit(self,local_60);
    if (pgVar1 != (gnode_r *)0x0) {
      for (key = (gnode_t *)0x0; key < local_58; key = (gnode_t *)((long)&key->tag + 1)) {
        if (key != e) {
          if (key < (gnode_t *)node->list1->n) {
            local_68 = node->list1->p[(long)key];
          }
          else {
            local_68 = (gnode_t *)0x0;
          }
          _Var2 = gnode_is_equal(local_60,local_68);
          if (_Var2) {
            _Var2 = gnode_is_literal_string(local_68);
            if (_Var2) {
              report_error(self,GRAVITY_ERROR_SEMANTIC,local_68,"Duplicated key %s in map.",
                           *(undefined8 *)&local_68[1].block_length);
            }
            else {
              report_error(self,GRAVITY_ERROR_SEMANTIC,local_68,"Duplicated key in map.");
            }
          }
        }
      }
      if (e < (gnode_t *)node->list2->n) {
        local_70 = node->list2->p[(long)e];
      }
      else {
        local_70 = (gnode_t *)0x0;
      }
      gvisit(self,local_70);
    }
  }
  return;
}

Assistant:

static void visit_list_expr (gvisitor_t *self, gnode_list_expr_t *node) {
    DEBUG_CODEGEN("visit_list_expr");
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    bool     ismap = node->ismap;
    uint32_t n = (uint32_t)gnode_array_size(node->list1);

    // a map requires twice registers than a list
    uint32_t max_fields = (ismap) ? MAX_FIELDSxFLUSH : MAX_FIELDSxFLUSH*2;

    // destination register of a new instruction is ALWAYS a temp register
    // then the optimizer could decide to optimize and merge the step
    uint32_t dest = ircode_register_push_temp(code);
	ircode_add(code, (ismap) ? MAPNEW : LISTNEW, dest, n, 0, LINE_NUMBER(node));
    if (n == 0) return;

    // this is just like Lua "fields per flush"
    // basically nodes are processed in a finite chunk
    // and then added to the list/map
    uint32_t nloops = n / max_fields;
    if (n % max_fields != 0) ++nloops;
    uint32_t nprocessed = 0;

	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
    while (nprocessed < n) {
        size_t k = (n - nprocessed > max_fields) ? max_fields : (n - nprocessed);
        size_t idxstart = nprocessed;
        size_t idxend = nprocessed + k;
        nprocessed += (uint32_t)k;

        // check if this chunk can be optimized
        // if (check_literals_list(self, node, ismap, idxstart, idxend, dest)) continue;

        // save register context
        ircode_push_context(code);

        // process each node
        for (size_t i=1, j=idxstart; j<idxend; ++j) {
            gnode_t *e = gnode_array_get(node->list1, j);
            visit(e);
            uint32_t nreg = ircode_register_pop_context_protect(code, true);
            if ((nreg == REGISTER_ERROR) || ((nreg <= dest) && (ircode_register_istemp(code, nreg)))) {
                report_error(self, (gnode_t *)e, "Invalid list expression.");
                continue;
            }

            if (nreg != dest + i) {
                uint32_t temp_register = ircode_register_push_temp(code);
				ircode_add(code, MOVE, temp_register, nreg, 0, LINE_NUMBER(node));
                ircode_register_clear(code, nreg);
                uint32_t temp = ircode_register_pop_context_protect(code, true);
                if (temp == REGISTER_ERROR) {report_error(self, (gnode_t *)e, "Unexpected register error."); continue;}
                if (temp_register != dest + i) {report_error(self, (gnode_t *)e, "Unexpected register computation."); continue;}
            }

            if (ismap) {
                e = gnode_array_get(node->list2, j);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
                visit(e);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
                nreg = ircode_register_pop_context_protect(code, true);
                if ((nreg == REGISTER_ERROR) || ((nreg <= dest) && (ircode_register_istemp(code, nreg)))) {
                    report_error(self, (gnode_t *)e, "Invalid map expression.");
                    continue;
                }

                if (nreg != dest + i + 1) {
                    uint32_t temp_register = ircode_register_push_temp(code);
					ircode_add(code, MOVE, temp_register, nreg, 0, LINE_NUMBER(node));
                    ircode_register_clear(code, nreg);
                    uint32_t temp = ircode_register_pop_context_protect(code, true);
                    if (temp == REGISTER_ERROR) {report_error(self, (gnode_t *)e, "Unexpected register error."); continue;}
                    if (temp_register != dest + i + 1) {report_error(self, (gnode_t *)e, "Unexpected register computation."); continue;}
                }
            }

            i += (ismap) ? 2 : 1;
        }

        // emit proper SETLIST instruction
        // since in a map registers are always used in pairs (key, value) it is
        // extremely easier to just set reg1 to be always 0 and use r in a loop
		ircode_add(code, SETLIST, dest, (uint32_t)(idxend-idxstart), 0, LINE_NUMBER(node));

        // restore register context
        ircode_pop_context(code);
    }

	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}